

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::AttachmentTest::makeDepthAndStencil
          (AttachmentTest *this,FboBuilder *builder)

{
  GLenum GVar1;
  bool bVar2;
  FormatFlags FVar3;
  FormatFlags f2;
  FormatDB *this_00;
  reference pIVar4;
  Attachment *att_00;
  ImageFormat IVar5;
  Attachment *att;
  ImageFormat format;
  _Self local_60;
  const_iterator it;
  Formats *formats;
  FormatFlags flags;
  FboBuilder *builder_local;
  AttachmentTest *this_local;
  
  if ((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.stencilKind ==
      (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.depthKind) {
    FVar3 = FboUtil::operator|(DEPTH_RENDERABLE,STENCIL_RENDERABLE);
    f2 = FboUtil::formatFlag((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).
                             m_params.stencilKind);
    FVar3 = FboUtil::operator|(FVar3,f2);
    this_00 = details::Context::getCoreFormats
                        ((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).
                         super_TestBase.m_ctx);
    FboUtil::FormatDB::getFormats((Formats *)&it,this_00,FVar3);
    local_60._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)&it);
    format = (ImageFormat)
             std::
             set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
             ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                    *)&it);
    bVar2 = std::operator!=(&local_60,(_Self *)&format);
    if (bVar2) {
      pIVar4 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_60);
      att_00 = makeAttachment((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).
                              m_params.depthKind,*pIVar4,0x40,0x40,builder);
      FboUtil::FboBuilder::glAttach(builder,0x8d00,att_00);
      FboUtil::FboBuilder::glAttach(builder,0x8d20,att_00);
    }
    std::
    set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
    ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
            *)&it);
    if (bVar2) {
      return;
    }
  }
  GVar1 = (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.stencilKind;
  IVar5 = FboUtil::ImageFormat::none();
  TestBase::attachTargetToNew((TestBase *)this,0x8d20,GVar1,IVar5,0x40,0x40,builder);
  GVar1 = (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.depthKind;
  IVar5 = FboUtil::ImageFormat::none();
  TestBase::attachTargetToNew((TestBase *)this,0x8d00,GVar1,IVar5,0x40,0x40,builder);
  return;
}

Assistant:

void AttachmentTest::makeDepthAndStencil (FboBuilder& builder)
{
	if (m_params.stencilKind == m_params.depthKind)
	{
		// If there is a common stencil+depth -format, try to use a common
		// image for both attachments.
		const FormatFlags flags =
			DEPTH_RENDERABLE | STENCIL_RENDERABLE | formatFlag(m_params.stencilKind);
		const Formats& formats = m_ctx.getCoreFormats().getFormats(flags);
		Formats::const_iterator it = formats.begin();
		if (it != formats.end())
		{
			const ImageFormat format = *it;
			Attachment* att = makeAttachment(m_params.depthKind, format, 64, 64, builder);
			builder.glAttach(GL_DEPTH_ATTACHMENT, att);
			builder.glAttach(GL_STENCIL_ATTACHMENT, att);
			return;
		}
	}
	// Either the kinds were separate, or a suitable format was not found.
	// Create separate images.
	attachTargetToNew(GL_STENCIL_ATTACHMENT, m_params.stencilKind, ImageFormat::none(),
					  64, 64, builder);
	attachTargetToNew(GL_DEPTH_ATTACHMENT, m_params.depthKind, ImageFormat::none(),
					  64, 64, builder);
}